

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chromosome.cpp
# Opt level: O0

void __thiscall Chromosome::createCoordinatePath(Chromosome *this,Coordinate start)

{
  bool bVar1;
  reference pTVar2;
  undefined1 local_68 [8];
  Coordinate next;
  TURNCODE turn;
  iterator __end1;
  iterator __begin1;
  vector<TURNCODE,_std::allocator<TURNCODE>_> *__range1;
  int iStack_38;
  Coordinate current;
  Chromosome *this_local;
  Coordinate start_local;
  
  current._4_8_ = this;
  std::vector<Coordinate,_std::allocator<Coordinate>_>::clear(&this->pathList);
  unique0x1000011a = start._0_8_;
  current.x = start.facing;
  std::vector<Coordinate,_std::allocator<Coordinate>_>::push_back
            (&this->pathList,(value_type *)((long)&__range1 + 4));
  __end1 = std::vector<TURNCODE,_std::allocator<TURNCODE>_>::begin(&this->turnList);
  register0x00000000 = std::vector<TURNCODE,_std::allocator<TURNCODE>_>::end(&this->turnList);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<TURNCODE_*,_std::vector<TURNCODE,_std::allocator<TURNCODE>_>_>
                                *)&next.facing);
    if (!bVar1) break;
    pTVar2 = __gnu_cxx::
             __normal_iterator<TURNCODE_*,_std::vector<TURNCODE,_std::allocator<TURNCODE>_>_>::
             operator*(&__end1);
    next.y = *pTVar2;
    local_68._0_4_ = __range1._4_4_;
    local_68._4_4_ = iStack_38;
    next.x = current.x;
    Coordinate::turnTo((Coordinate *)local_68,next.y);
    std::vector<Coordinate,_std::allocator<Coordinate>_>::push_back
              (&this->pathList,(value_type *)local_68);
    __range1._4_4_ = local_68._0_4_;
    iStack_38 = local_68._4_4_;
    current.x = next.x;
    __gnu_cxx::__normal_iterator<TURNCODE_*,_std::vector<TURNCODE,_std::allocator<TURNCODE>_>_>::
    operator++(&__end1);
  }
  return;
}

Assistant:

void Chromosome::createCoordinatePath(Coordinate start) {
    pathList.clear();
    Coordinate current = start;
    pathList.push_back(current);
    for (auto turn: turnList){
        Coordinate next = current;
        next.turnTo(turn);
        pathList.push_back(next);
        current = next;
    }
}